

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictTrie.hpp
# Opt level: O2

void __thiscall cppjieba::DictTrie::LoadDict(DictTrie *this,string *filePath)

{
  double weight;
  pointer word;
  char cVar1;
  ostream *poVar2;
  istream *piVar3;
  allocator local_479;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  buf;
  string line;
  DictUnit node_info;
  Logger local_3b8;
  ifstream ifs;
  
  std::ifstream::ifstream(&ifs,(filePath->_M_dataplus)._M_p,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    limonp::Logger::Logger
              (&local_3b8,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/DictTrie.hpp"
               ,0xcb);
    poVar2 = std::operator<<((ostream *)&local_3b8,"exp: [ifs.is_open()");
    poVar2 = std::operator<<(poVar2,"] false. ");
    poVar2 = std::operator<<(poVar2,"open ");
    poVar2 = std::operator<<(poVar2,(string *)filePath);
    std::operator<<(poVar2," failed.");
    limonp::Logger::~Logger(&local_3b8);
  }
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  buf.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  node_info.word.size_ = 0;
  buf.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  buf.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  node_info.word.capacity_ = 0x10;
  node_info.tag._M_dataplus._M_p = (pointer)&node_info.tag.field_2;
  node_info.tag._M_string_length = 0;
  node_info.tag.field_2._M_local_buf[0] = '\0';
  node_info.word.ptr_ = (uint *)&node_info;
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&ifs,(string *)&line);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
    std::__cxx11::string::string((string *)&local_3b8," ",&local_479);
    limonp::Split(&line,&buf,(string *)&local_3b8,0xffffffffffffffff);
    std::__cxx11::string::~string((string *)&local_3b8);
    if ((long)buf.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)buf.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x60) {
      limonp::Logger::Logger
                (&local_3b8,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/DictTrie.hpp"
                 ,0xd2);
      poVar2 = std::operator<<((ostream *)&local_3b8,"exp: [buf.size() == DICT_COLUMN_NUM");
      poVar2 = std::operator<<(poVar2,"] false. ");
      poVar2 = std::operator<<(poVar2,"split result illegal, line:");
      std::operator<<(poVar2,(string *)&line);
      limonp::Logger::~Logger(&local_3b8);
    }
    word = buf.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    weight = atof(buf.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
    MakeNodeInfo(this,&node_info,word,weight,word + 2);
    std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::push_back
              (&this->static_node_infos_,&node_info);
  }
  DictUnit::~DictUnit(&node_info);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&buf);
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&ifs);
  return;
}

Assistant:

void LoadDict(const string& filePath) {
    ifstream ifs(filePath.c_str());
    XCHECK(ifs.is_open()) << "open " << filePath << " failed.";
    string line;
    vector<string> buf;

    DictUnit node_info;
    for (size_t lineno = 0; getline(ifs, line); lineno++) {
      Split(line, buf, " ");
      XCHECK(buf.size() == DICT_COLUMN_NUM) << "split result illegal, line:" << line;
      MakeNodeInfo(node_info, 
            buf[0], 
            atof(buf[1].c_str()), 
            buf[2]);
      static_node_infos_.push_back(node_info);
    }
  }